

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

QString * __thiscall
QUrlQuery::query(QString *__return_storage_ptr__,QUrlQuery *this,ComponentFormattingOptions encoding
                )

{
  pair<QString,_QString> *ppVar1;
  undefined2 ch;
  uint uVar2;
  QUrlQueryPrivate *pQVar3;
  pair<QString,_QString> *ppVar4;
  int iVar5;
  long lVar6;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  uint local_40 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = (this->d).d.ptr;
  if (pQVar3 == (QUrlQueryPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
  }
  else {
    uVar2._0_2_ = pQVar3->valueDelimiter;
    uVar2._2_2_ = pQVar3->pairDelimiter;
    auVar7 = pshuflw(ZEXT416(uVar2),ZEXT416(uVar2),0xe1);
    local_40[0] = auVar7._0_4_ | (uint)DAT_00469180;
    local_40[1] = 0;
    if (((uint)encoding.super_QFlagsStorageHelper<QUrl::ComponentFormattingOption,_4>.
               super_QFlagsStorage<QUrl::ComponentFormattingOption>.i & 0xc00000) != 0) {
      local_40[1] = 0x223;
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
    ppVar4 = (pQVar3->itemList).d.ptr;
    lVar6 = (pQVar3->itemList).d.size;
    ppVar1 = ppVar4 + lVar6;
    iVar5 = 0;
    for (lVar6 = lVar6 * 0x30; lVar6 != 0; lVar6 = lVar6 + -0x30) {
      iVar5 = iVar5 + (int)(ppVar4->first).d.size + (int)(ppVar4->second).d.size + 2;
      ppVar4 = ppVar4 + 1;
    }
    QString::reserve(__return_storage_ptr__,(long)(iVar5 / 4 + iVar5));
    for (ppVar4 = (((this->d).d.ptr)->itemList).d.ptr; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
      if ((__return_storage_ptr__->d).size != 0) {
        QString::append(__return_storage_ptr__,(QChar)(((this->d).d.ptr)->pairDelimiter).ucs);
      }
      recodeAndAppend(__return_storage_ptr__,&ppVar4->first,encoding,(ushort *)local_40);
      if ((ppVar4->second).d.ptr != (char16_t *)0x0) {
        ch = ((this->d).d.ptr)->valueDelimiter;
        QString::append(__return_storage_ptr__,(QChar)ch);
        recodeAndAppend(__return_storage_ptr__,&ppVar4->second,encoding,(ushort *)local_40);
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

QString QUrlQuery::query(QUrl::ComponentFormattingOptions encoding) const
{
    if (!d)
        return QString();

    // unlike the component encoding, for the whole query we need to modify a little:
    //  - the "#" character is unambiguous, so we encode it in EncodeDelimiters mode
    //  - the query delimiter pair must always be encoded

    // start with what's always encoded
    ushort tableActions[] = {
        encode(d->pairDelimiter.unicode()),  // 0
        encode(d->valueDelimiter.unicode()), // 1
        0,                                   // 2
        0
    };
    if (encoding & QUrl::EncodeDelimiters) {
        tableActions[2] = encode('#');
    }

    QString result;
    Map::const_iterator it = d->itemList.constBegin();
    Map::const_iterator end = d->itemList.constEnd();

    {
        int size = 0;
        for ( ; it != end; ++it)
            size += it->first.size() + 1 + it->second.size() + 1;
        result.reserve(size + size / 4);
    }

    for (it = d->itemList.constBegin(); it != end; ++it) {
        if (!result.isEmpty())
            result += QChar(d->pairDelimiter);
        recodeAndAppend(result, it->first, encoding, tableActions);
        if (!it->second.isNull()) {
            result += QChar(d->valueDelimiter);
            recodeAndAppend(result, it->second, encoding, tableActions);
        }
    }
    return result;
}